

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

char * CVmObjList::list_to_string(vm_val_t *retval,vm_val_t *self,int radix,int flags)

{
  vm_obj_id_t obj;
  int iVar1;
  CVmObject *pCVar2;
  char *pcVar3;
  undefined8 in_RSI;
  vm_val_t *in_RDI;
  vm_val_t *unaff_retaddr;
  vm_val_t newele;
  vm_val_t ele;
  int i;
  CVmObjList *newlst;
  vm_val_t newlstval;
  int n;
  size_t in_stack_00000088;
  char *in_stack_00000090;
  vm_val_t *in_stack_00000098;
  vm_val_t *in_stack_000000a0;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  vm_val_t *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  vm_val_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  vm_val_t local_30;
  int local_1c;
  
  local_1c = vm_val_t::ll_length(in_stack_ffffffffffffffa8);
  obj = create(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  vm_val_t::set_obj(&local_30,obj);
  if (local_30.val.obj != 0) {
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[1])(pCVar2,metaclass_reg_);
    if (iVar1 != 0) {
      pCVar2 = vm_objp(0);
      goto LAB_0031cb98;
    }
  }
  pCVar2 = (CVmObject *)0x0;
LAB_0031cb98:
  cons_clear((CVmObjList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  CVmStack::push(&local_30);
  for (iVar1 = 0; iVar1 < local_1c; iVar1 = iVar1 + 1) {
    vm_val_t::ll_index((vm_val_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    CVmBifTADS::toString(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    cons_set_element((CVmObjList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (size_t)pCVar2,(vm_val_t *)0x31cc08);
  }
  join(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088);
  CVmStack::discard(1);
  pcVar3 = vm_val_t::get_as_string((vm_val_t *)pCVar2);
  return pcVar3;
}

Assistant:

const char *CVmObjList::list_to_string(
    VMG_ vm_val_t *retval, const vm_val_t *self, int radix, int flags)
{
    /* count our elements */
    int n = self->ll_length(vmg0_);

    /* create a list with the same number of elements */
    vm_val_t newlstval;
    newlstval.set_obj(create(vmg_ FALSE, n));
    CVmObjList *newlst = vm_objid_cast(CVmObjList, newlstval.val.obj);
    newlst->cons_clear();

    /* push the new list for gc protection */
    G_stk->push(&newlstval);

    /* set up the new list as self.mapAll({x: toString(x)}) */
    for (int i = 0 ; i < n ; ++i)
    {
        /* get this element of the old list */
        vm_val_t ele;
        self->ll_index(vmg_ &ele, i+1);

        /* convert it to a string */
        vm_val_t newele;
        CVmBifTADS::toString(vmg_ &newele, &ele, radix, flags);

        /* store the result in the new list */
        newlst->cons_set_element(i, &newele);
    }

    /* convert the new list to a string using the basic join with commas */
    join(vmg_ retval, &newlstval, ",", 1);

    /* discard gc protection */
    G_stk->discard(1);

    /* return the new string */
    return retval->get_as_string(vmg0_);
}


/* ------------------------------------------------------------------------ */
/*
 *   Property evaluator - generate (static property)
 */
int CVmObjList::static_getp_generate(VMG_ vm_val_t *retval, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the callback function argument */
    vm_val_t *func = G_stk->get(0);

    /* make sure it's a function; set up a header pointer if it is */
    CVmFuncPtr funcdesc;
    if (!funcdesc.set(vmg_ func))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the count */
    int32_t cnt = G_stk->get(1)->num_to_int(vmg0_);

    /* make sure it's not negative */
    if (cnt < 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* create the list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* push the list value for gc protection */
    G_stk->push(retval);

    /* zero the element count, so that the gc doesn't deref garbage */
    lst->cons_set_len(0);

    /* find out how many arguments the function wants */
    int fargc = funcdesc.is_varargs() ? -1 : funcdesc.get_max_argc();

    /* set up our recursive call descriptor */
    vm_rcdesc rc(vmg_ "List.generate",
                 CVmObjList::metaclass_reg_->get_class_obj(vmg0_),
                 PROPIDX_generate, func, argc);

    /* generate the elements */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* push the callback arguments */
        const int pushed_argc = 1;
        G_stk->push()->set_int(i+1);

        /* adjust the arguments for what the callback actually wants */
        int sent_argc = fargc < 0 || fargc > pushed_argc ? pushed_argc : fargc;

        /* call the callback */
        G_interpreter->call_func_ptr(vmg_ func, sent_argc, &rc, 0);

        /* discard excess arguments */
        G_stk->discard(pushed_argc - sent_argc);

        /* add the result to the list */
        lst->cons_set_len(i+1);
        lst->cons_set_element(i, G_interpreter->get_r0());
    }

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}

/* ------------------------------------------------------------------------ */
/*
 *   Property evaluator: get the index of the element with the minimum value 
 */
int CVmObjList::getp_indexOfMin(VMG_ vm_val_t *retval,
                                const vm_val_t *self_val,
                                const char *lst, uint *in_argc)
{
    /* do the general calculation to select the minimum value ("-1") */
    vm_rcdesc rc(vmg_ "List.indexOfMin", self_val, 29, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, -1, TRUE);
}

/*
 *   Property evaluator: get the value of the element with the minimum value 
 */
int CVmObjList::getp_minVal(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* do the general calculation to select the minimum value ("-1") */
    vm_rcdesc rc(vmg_ "List.minVal", self_val, 30, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, -1, FALSE);
}

/*
 *   Property evaluator: get the index of the element with the maximum value 
 */
int CVmObjList::getp_indexOfMax(VMG_ vm_val_t *retval,
                                const vm_val_t *self_val,
                                const char *lst, uint *in_argc)
{
    /* do the general calculation to select the maximum value ("+1") */
    vm_rcdesc rc(vmg_ "List.indexOfMax", self_val, 31, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, 1, TRUE);
}

/*
 *   Property evaluator: get the value of the element with the maximum value 
 */
int CVmObjList::getp_maxVal(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* do the general calculation to select the maximum value ("+1") */
    vm_rcdesc rc(vmg_ "List.maxVal", self_val, 32, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, 1, FALSE);
}

/*
 *   General handling for minIndex, minVal, maxIndex, and maxVal.  This finds
 *   the highest/lowest value in the list, optionally mapped through a
 *   callback function.  Returns the winning element's index and value.
 *   
 *   'sense' is the sense of the search: -1 for minimum, 1 for maximum.
 *   'want_index' is true if 'retval' should be set to the index of the
 *   winning element, false if 'retval' should be set to the winning
 *   element's value.  
 */
int CVmObjList::get_minmax(VMG_ vm_val_t *retval,
                           const vm_val_t *self_val,
                           const char *lst, uint *in_argc,
                           const vm_rcdesc *rc, int sense, int want_index)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'func' argument is valid */
    const vm_val_t *cb = 0;
    if (argc >= 1)
    {
        cb = G_stk->get(0);
        if (!cb->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* if there are no elements, this is an error */
    int cnt = vmb_get_len(lst);
    if (cnt == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* we don't have a winner yet */
    int winner_idx = 0;
    vm_val_t winner;

    /* run through the list */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* get this element */
        vm_val_t ele;
        get_element_const(lst, i, &ele);

        /* if there's a callback, invoke it */
        if (cb != 0)
        {
            /* invoke the callback with the element value as the argument */
            G_stk->push(&ele);
            G_interpreter->call_func_ptr(vmg_ cb, 1, rc, 0);

            /* use the result as the comparison value */
            ele = *G_interpreter->get_r0();
        }

        /* compare it to the winner so far, and keep the lower value */
        if (i == 0)
        {
            /* it's the first element, so it's the default winner so far */
            winner_idx = i;
            winner = ele;
        }
        else
        {
            /* compare it to the winner so far */
            int cmp = ele.compare_to(vmg_ &winner);

            /* keep it if it's the min/max so far */
            if ((sense > 0 && cmp > 0) || (sense < 0 && cmp < 0))
            {
                winner_idx = i;
                winner = ele;
            }
        }
    }

    /* remove gc protection and arguments */
    G_stk->discard(argc + 1);
    
    /* return the winning index (note: 1-based) or value, as desired */
    if (want_index)
        retval->set_int(winner_idx + 1);
    else
        *retval = winner;
        
    /* handled */
    return TRUE;
}



/* ------------------------------------------------------------------------ */
/*
 *   Constant-pool list object 
 */

/*
 *   create 
 */
vm_obj_id_t CVmObjListConst::create(VMG_ const char *const_ptr)
{
    /* create our new ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* create our list object, pointing directly to the constant pool */
    new (vmg_ id) CVmObjListConst(vmg_ const_ptr);

    /* return the new ID */
    return id;
}